

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.h
# Opt level: O2

uint256 * __thiscall
CDiskBlockIndex::ConstructBlockHash(uint256 *__return_storage_ptr__,CDiskBlockIndex *this)

{
  long in_FS_OFFSET;
  CBlockHeader local_70;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  CBlockHeader::CBlockHeader(&local_70);
  local_70.nVersion = (this->super_CBlockIndex).nVersion;
  local_70.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)&(this->super_CBlockIndex).field_0x94;
  local_70.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = this->field_0x9c;
  local_70.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = this->field_0x9d;
  local_70.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = this->field_0x9e;
  local_70.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = this->field_0x9f;
  local_70.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = this->field_0xa0;
  local_70.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = this->field_0xa1;
  local_70.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = this->field_0xa2;
  local_70.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = this->field_0xa3;
  local_70.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = this->field_0xa4;
  local_70.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = this->field_0xa5;
  local_70.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = this->field_0xa6;
  local_70.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = this->field_0xa7;
  local_70.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = this->field_0xa8;
  local_70.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = this->field_0xa9;
  local_70.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = this->field_0xaa;
  local_70.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = this->field_0xab;
  local_70.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = this->field_0xac;
  local_70.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = this->field_0xad;
  local_70.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = this->field_0xae;
  local_70.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = this->field_0xaf;
  local_70.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = this->field_0xb0;
  local_70.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = this->field_0xb1;
  local_70.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = this->field_0xb2;
  local_70.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = this->field_0xb3;
  local_70.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(this->super_CBlockIndex).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
  ;
  local_70.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)
        ((this->super_CBlockIndex).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 8);
  local_70.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)
        ((this->super_CBlockIndex).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x10);
  local_70.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)
        ((this->super_CBlockIndex).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x18);
  local_70.nTime = (this->super_CBlockIndex).nTime;
  local_70.nBits = (this->super_CBlockIndex).nBits;
  local_70.nNonce = (this->super_CBlockIndex).nNonce;
  CBlockHeader::GetHash(__return_storage_ptr__,&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

uint256 ConstructBlockHash() const
    {
        CBlockHeader block;
        block.nVersion = nVersion;
        block.hashPrevBlock = hashPrev;
        block.hashMerkleRoot = hashMerkleRoot;
        block.nTime = nTime;
        block.nBits = nBits;
        block.nNonce = nNonce;
        return block.GetHash();
    }